

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O2

int __thiscall
Timer::
run_at<void(&)(std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,int),std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>&,int&>
          (Timer *this,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *time_point,
          _func_void_time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_int
          *f,time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             *args,int *args_1)

{
  atomic<int> *paVar1;
  int iVar2;
  unique_lock<std::mutex> lock;
  TimerNode s;
  
  s.tn_is_period = false;
  s.tn_is_repeated = false;
  s.tn_tm_point.__d.__r = (duration)0;
  s.tn_callback.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  s.tn_callback.super__Function_base._M_functor._8_8_ = 0;
  s.tn_callback.super__Function_base._M_manager = (_Manager_type)0x0;
  s.tn_callback._M_invoker = (_Invoker_type)0x0;
  LOCK();
  paVar1 = &this->tm_id;
  s.tn_id = (paVar1->super___atomic_base<int>)._M_i;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  lock._M_device = (mutex_type *)((ulong)lock._M_device & 0xffffffff00000000);
  hash_map<int,_Timer::IdState>::emplace(&this->tm_id_state_map,&s.tn_id,(IdState *)&lock);
  s._52_2_ = s._52_2_ & 0xff00;
  s.tn_tm_point =
       (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        )(time_point->__d).__r;
  lock._8_4_ = *args_1;
  lock._M_device = (mutex_type *)f;
  std::function<void()>::operator=
            ((function<void()> *)&s.tn_callback,
             (_Bind<void_(*(std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_int))(std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_int)>
              *)&lock);
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->tm_mutex);
  std::
  priority_queue<Timer::TimerNode,_std::vector<Timer::TimerNode,_std::allocator<Timer::TimerNode>_>,_std::less<Timer::TimerNode>_>
  ::push(&this->tm_queue,&s);
  std::condition_variable::notify_all();
  iVar2 = s.tn_id;
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  std::_Function_base::~_Function_base(&s.tn_callback.super__Function_base);
  return iVar2;
}

Assistant:

int run_at(const chrono::time_point<chrono::high_resolution_clock>& time_point, F&& f,
                            Args&&... args) {
        TimerNode s;
        s.tn_id = tm_id.fetch_add(1);
        tm_id_state_map.emplace(s.tn_id, IdState::Running);
        s.tn_is_period = false;
        s.tn_tm_point = time_point;
        // TODO: use lamda, tuple and apply of C++17 replacing bind
        s.tn_callback = bind(forward<F>(f), forward<Args>(args)...);
        unique_lock<mutex> lock(tm_mutex);
        tm_queue.push(s);
        tm_cond.notify_all();

        return s.tn_id;
    }